

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApprox.c
# Opt level: O0

DdNode * UAbuildSubset(DdManager *dd,DdNode *node,ApproxInfo *info)

{
  int iVar1;
  NodeData *local_70;
  NodeData *local_68;
  char *local_60;
  NodeData *infoN;
  DdNode *r;
  DdNode *e;
  DdNode *t;
  DdNode *N;
  DdNode *Ne;
  DdNode *Nt;
  ApproxInfo *info_local;
  DdNode *node_local;
  DdManager *dd_local;
  
  dd_local = (DdManager *)node;
  if (*(int *)((ulong)node & 0xfffffffffffffffe) != 0x7fffffff) {
    t = (DdNode *)((ulong)node & 0xfffffffffffffffe);
    Nt = (DdNode *)info;
    info_local = (ApproxInfo *)node;
    node_local = &dd->sentinel;
    iVar1 = st__lookup(info->table,(char *)t,&local_60);
    if (iVar1 == 0) {
      fprintf((FILE *)node_local[0xf].type.kids.T,"Something is wrong, ought to be in info table\n")
      ;
      *(undefined4 *)((long)&node_local[0xf].type + 8) = 5;
      dd_local = (DdManager *)0x0;
    }
    else if (local_60[0x15] == '\x01') {
      dd_local = (DdManager *)Nt->next;
    }
    else {
      if ((ApproxInfo *)t == info_local) {
        if (*(long *)(local_60 + 0x18) != 0) {
          return *(DdNode **)(local_60 + 0x18);
        }
      }
      else if (*(long *)(local_60 + 0x20) != 0) {
        return *(DdNode **)(local_60 + 0x20);
      }
      Ne = (DdNode *)((ulong)(t->type).kids.T ^ (long)(int)((uint)info_local & 1));
      N = (DdNode *)((ulong)(t->type).kids.E ^ (long)(int)((uint)info_local & 1));
      e = UAbuildSubset((DdManager *)node_local,Ne,(ApproxInfo *)Nt);
      if (e == (DdNode *)0x0) {
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)e & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)e & 0xfffffffffffffffe) + 4) + 1;
        r = UAbuildSubset((DdManager *)node_local,N,(ApproxInfo *)Nt);
        if (r == (DdNode *)0x0) {
          Cudd_RecursiveDeref((DdManager *)node_local,e);
          dd_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)r & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)r & 0xfffffffffffffffe) + 4) + 1;
          if (((ulong)e & 1) == 0) {
            if (e == r) {
              local_70 = (NodeData *)e;
            }
            else {
              local_70 = (NodeData *)cuddUniqueInter((DdManager *)node_local,t->index,e,r);
            }
            infoN = local_70;
            if (local_70 == (NodeData *)0x0) {
              Cudd_RecursiveDeref((DdManager *)node_local,r);
              Cudd_RecursiveDeref((DdManager *)node_local,e);
              return (DdNode *)0x0;
            }
          }
          else {
            local_68 = (NodeData *)((ulong)e ^ 1);
            r = (DdNode *)((ulong)r ^ 1);
            e = (DdNode *)local_68;
            if (local_68 != (NodeData *)r) {
              local_68 = (NodeData *)
                         cuddUniqueInter((DdManager *)node_local,t->index,(DdNode *)local_68,r);
            }
            infoN = local_68;
            if (local_68 == (NodeData *)0x0) {
              Cudd_RecursiveDeref((DdManager *)node_local,r);
              Cudd_RecursiveDeref((DdManager *)node_local,e);
              return (DdNode *)0x0;
            }
            infoN = (NodeData *)((ulong)local_68 ^ 1);
          }
          *(int *)(((ulong)e & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)e & 0xfffffffffffffffe) + 4) + -1;
          *(int *)(((ulong)r & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)r & 0xfffffffffffffffe) + 4) + -1;
          if ((ApproxInfo *)t == info_local) {
            *(NodeData **)(local_60 + 0x18) = infoN;
          }
          else {
            *(NodeData **)(local_60 + 0x20) = infoN;
          }
          dd_local = (DdManager *)infoN;
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

static DdNode *
UAbuildSubset(
  DdManager * dd /* DD manager */,
  DdNode * node /* current node */,
  ApproxInfo * info /* node info */)
{

    DdNode *Nt, *Ne, *N, *t, *e, *r;
    NodeData *infoN;

    if (Cudd_IsConstant(node))
        return(node);

    N = Cudd_Regular(node);

    if ( st__lookup(info->table, (const char *)N, (char **)&infoN)) {
        if (infoN->replace == TRUE) {
            return(info->zero);
        }
        if (N == node ) {
            if (infoN->resultP != NULL) {
                return(infoN->resultP);
            }
        } else {
            if (infoN->resultN != NULL) {
                return(infoN->resultN);
            }
        }
    } else {
        (void) fprintf(dd->err,
                       "Something is wrong, ought to be in info table\n");
        dd->errorCode = CUDD_INTERNAL_ERROR;
        return(NULL);
    }

    Nt = Cudd_NotCond(cuddT(N), Cudd_IsComplement(node));
    Ne = Cudd_NotCond(cuddE(N), Cudd_IsComplement(node));

    t = UAbuildSubset(dd, Nt, info);
    if (t == NULL) {
        return(NULL);
    }
    cuddRef(t);

    e = UAbuildSubset(dd, Ne, info);
    if (e == NULL) {
        Cudd_RecursiveDeref(dd,t);
        return(NULL);
    }
    cuddRef(e);

    if (Cudd_IsComplement(t)) {
        t = Cudd_Not(t);
        e = Cudd_Not(e);
        r = (t == e) ? t : cuddUniqueInter(dd, N->index, t, e);
        if (r == NULL) {
            Cudd_RecursiveDeref(dd, e);
            Cudd_RecursiveDeref(dd, t);
            return(NULL);
        }
        r = Cudd_Not(r);
    } else {
        r = (t == e) ? t : cuddUniqueInter(dd, N->index, t, e);
        if (r == NULL) {
            Cudd_RecursiveDeref(dd, e);
            Cudd_RecursiveDeref(dd, t);
            return(NULL);
        }
    }
    cuddDeref(t);
    cuddDeref(e);

    if (N == node) {
        infoN->resultP = r;
    } else {
        infoN->resultN = r;
    }

    return(r);

}